

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::rebuild
          (HighsCliqueTable *this,HighsInt ncols,HighsPostsolveStack *postSolveStack,
          HighsDomain *globaldomain,vector<int,_std::allocator<int>_> *orig2reducedcol,
          vector<int,_std::allocator<int>_> *orig2reducedrow)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  uint *puVar6;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var7;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var8;
  difference_type dVar9;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  HighsInt origin;
  HighsInt numvars;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  newend;
  HighsInt col;
  HighsInt k;
  HighsInt i;
  HighsInt ncliques;
  HighsCliqueTable newCliqueTable;
  undefined4 in_stack_fffffffffffffd38;
  HighsInt in_stack_fffffffffffffd3c;
  HighsDomain *in_stack_fffffffffffffd40;
  pointer *this_00;
  int local_230;
  int local_22c;
  HighsInt in_stack_fffffffffffffddc;
  HighsCliqueTable *in_stack_fffffffffffffde0;
  HighsInt in_stack_fffffffffffffe5c;
  undefined1 in_stack_fffffffffffffe63;
  HighsInt in_stack_fffffffffffffe64;
  _Base_ptr in_stack_fffffffffffffe68;
  HighsCliqueTable *in_stack_fffffffffffffe70;
  
  HighsCliqueTable(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  setPresolveFlag((HighsCliqueTable *)&stack0xfffffffffffffde8,
                  (bool)(*(byte *)&in_RDI[0x13].
                                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage & 1));
  setMinEntriesForParallelism
            ((HighsCliqueTable *)&stack0xfffffffffffffde8,
             *(HighsInt *)
              ((long)&in_RDI[0x13].
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4));
  sVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
                    ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                     &in_RDI[7].
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (local_22c = 0; local_22c != (int)sVar3; local_22c = local_22c + 1) {
    pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)&in_RDI[7].
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_22c);
    if (pvVar4->start != -1) {
      pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)&in_RDI[7].
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_22c);
      for (local_230 = pvVar4->start;
          pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ::operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                                 *)&in_RDI[7].
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)local_22c), local_230 != pvVar4->end;
          local_230 = local_230 + 1) {
        pvVar5 = std::
                 vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                 operator[](in_RDI,(long)local_230);
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   (in_R8,(ulong)((uint)*pvVar5 & 0x7fffffff));
        uVar1 = *puVar6;
        if (((uVar1 == 0xffffffff) ||
            (bVar2 = HighsDomain::isBinary(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c),
            !bVar2)) ||
           (bVar2 = presolve::HighsPostsolveStack::isColLinearlyTransformable
                              ((HighsPostsolveStack *)in_stack_fffffffffffffd40,
                               in_stack_fffffffffffffd3c), !bVar2)) {
          pvVar5 = std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::operator[](in_RDI,(long)local_230);
          *pvVar5 = (value_type)((uint)*pvVar5 & 0x80000000 | 0x7fffffff);
        }
        else {
          pvVar5 = std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::operator[](in_RDI,(long)local_230);
          *pvVar5 = (value_type)((uint)*pvVar5 & 0x80000000 | uVar1 & 0x7fffffff);
        }
      }
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::begin
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      this_00 = &in_RDI[7].
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                 this_00,(long)local_22c);
      _Var7 = __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
              ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                           *)this_00,(difference_type)in_stack_fffffffffffffd40);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::begin
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                 this_00,(long)local_22c);
      _Var8 = __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
              ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                           *)this_00,(difference_type)in_stack_fffffffffffffd40);
      std::
      remove_if<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::rebuild(int,presolve::HighsPostsolveStack_const&,HighsDomain_const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)::__0>
                (_Var7._M_current,_Var8._M_current);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::begin
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                 &in_RDI[7].
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_22c);
      __gnu_cxx::
      __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
      ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   *)this_00,(difference_type)in_stack_fffffffffffffd40);
      dVar9 = __gnu_cxx::operator-
                        ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffd40,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      if (1 < (int)dVar9) {
        in_stack_fffffffffffffd40 =
             (HighsDomain *)
             &in_RDI[7].
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                  ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                   in_stack_fffffffffffffd40,(long)local_22c);
        pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
                 operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                             *)in_stack_fffffffffffffd40,(long)local_22c);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        operator[](in_RDI,(long)pvVar4->start);
        doAddClique(in_stack_fffffffffffffe70,(CliqueVar *)in_stack_fffffffffffffe68,
                    in_stack_fffffffffffffe64,(bool)in_stack_fffffffffffffe63,
                    in_stack_fffffffffffffe5c);
      }
    }
  }
  operator=((HighsCliqueTable *)in_stack_fffffffffffffd40,
            (HighsCliqueTable *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  ~HighsCliqueTable((HighsCliqueTable *)in_stack_fffffffffffffd40);
  return;
}

Assistant:

void HighsCliqueTable::rebuild(
    HighsInt ncols, const presolve::HighsPostsolveStack& postSolveStack,
    const HighsDomain& globaldomain,
    const std::vector<HighsInt>& orig2reducedcol,
    const std::vector<HighsInt>& orig2reducedrow) {
  HighsCliqueTable newCliqueTable(ncols);
  newCliqueTable.setPresolveFlag(inPresolve);
  newCliqueTable.setMinEntriesForParallelism(minEntriesForParallelism);
  HighsInt ncliques = cliques.size();
  for (HighsInt i = 0; i != ncliques; ++i) {
    if (cliques[i].start == -1) continue;

    for (HighsInt k = cliques[i].start; k != cliques[i].end; ++k) {
      HighsInt col = orig2reducedcol[cliqueentries[k].col];

      if (col == -1 || !globaldomain.isBinary(col) ||
          !postSolveStack.isColLinearlyTransformable(col))
        cliqueentries[k].col = kHighsIInf;
      else
        cliqueentries[k].col = col;
    }

    auto newend =
        std::remove_if(cliqueentries.begin() + cliques[i].start,
                       cliqueentries.begin() + cliques[i].end,
                       [](CliqueVar v) { return v.col == kHighsIInf; });
    HighsInt numvars = newend - (cliqueentries.begin() + cliques[i].start);
    // since we do not know how variables in the clique that have been deleted
    // are replaced (i.e. are they fixed to 0 or 1, or substituted) we relax
    // them out which means the equality status needs to be set to false
    if (numvars <= 1) continue;

    HighsInt origin = cliques[i].origin != kHighsIInf ? -1 : kHighsIInf;
    newCliqueTable.doAddClique(&cliqueentries[cliques[i].start], numvars, false,
                               origin);
  }

  *this = std::move(newCliqueTable);
}